

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1992(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1ba;
  allocator<char> local_1b9;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1b8;
  SyntaxKind local_1a0 [4];
  string local_198;
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"__real__ ( __real__ x )",&local_1b9);
  Expectation::Expectation(&local_178);
  local_1a0[0] = ExtGNU_RealExpression;
  local_1a0[1] = ParenthesizedExpression;
  local_1a0[2] = ExtGNU_RealExpression;
  local_1a0[3] = IdentifierName;
  __l._M_len = 4;
  __l._M_array = local_1a0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1b8,__l,
             &local_1ba);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1b8);
  Expectation::Expectation(&local_c0,pEVar1);
  parseExpression(this,&local_198,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1b8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void ParserTester::case1992()
{
    parseExpression("__real__ ( __real__ x )",
                    Expectation().AST( { SyntaxKind::ExtGNU_RealExpression,
                                         SyntaxKind::ParenthesizedExpression,
                                         SyntaxKind::ExtGNU_RealExpression,
                                         SyntaxKind::IdentifierName }));
}